

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  pointer pDVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  pointer pnVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  fpclass_type fVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  pointer pnVar16;
  ulong uVar17;
  int32_t iVar18;
  VarStatus VVar19;
  long lVar20;
  uint uVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  int iVar22;
  long lVar23;
  cpp_dec_float<50U,_int,_void> *pcVar24;
  cpp_dec_float<50U,_int,_void> *pcVar25;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar26;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slack;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_398;
  uint local_35c;
  cpp_dec_float<50U,_int,_void> local_358;
  FreeZeroObjVariablePS *local_318;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_310;
  cpp_dec_float<50U,_int,_void> local_308;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  cpp_dec_float<50U,_int,_void> local_2b8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_278;
  long local_270;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_1e8;
  fpclass_type local_1c8;
  int32_t iStack_1c4;
  undefined8 uStack_1c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b0;
  cpp_dec_float<50U,_int,_void> local_1a8;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [4];
  uint local_138 [2];
  uint auStack_130 [2];
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar12 = this->m_j;
  iVar22 = this->m_old_j;
  if (iVar12 != iVar22) {
    pnVar16 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar16[iVar22].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar16[iVar12].m_backend.data._M_elems + 8);
    uVar5 = *(undefined8 *)&pnVar16[iVar12].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar16[iVar12].m_backend.data._M_elems + 2);
    puVar1 = pnVar16[iVar12].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar16[iVar22].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar9;
    *(undefined8 *)&pnVar16[iVar22].m_backend.data = uVar5;
    *(undefined8 *)(pnVar16[iVar22].m_backend.data._M_elems + 2) = uVar8;
    pnVar16[iVar22].m_backend.exp = pnVar16[iVar12].m_backend.exp;
    pnVar16[iVar22].m_backend.neg = pnVar16[iVar12].m_backend.neg;
    iVar18 = pnVar16[iVar12].m_backend.prec_elem;
    pnVar16[iVar22].m_backend.fpclass = pnVar16[iVar12].m_backend.fpclass;
    pnVar16[iVar22].m_backend.prec_elem = iVar18;
    iVar12 = this->m_j;
    pnVar16 = (r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar22 = this->m_old_j;
    *(undefined8 *)(pnVar16[iVar22].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar16[iVar12].m_backend.data._M_elems + 8);
    uVar5 = *(undefined8 *)&pnVar16[iVar12].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar16[iVar12].m_backend.data._M_elems + 2);
    puVar1 = pnVar16[iVar12].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar16[iVar22].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar9;
    *(undefined8 *)&pnVar16[iVar22].m_backend.data = uVar5;
    *(undefined8 *)(pnVar16[iVar22].m_backend.data._M_elems + 2) = uVar8;
    pnVar16[iVar22].m_backend.exp = pnVar16[iVar12].m_backend.exp;
    pnVar16[iVar22].m_backend.neg = pnVar16[iVar12].m_backend.neg;
    iVar18 = pnVar16[iVar12].m_backend.prec_elem;
    pnVar16[iVar22].m_backend.fpclass = pnVar16[iVar12].m_backend.fpclass;
    pnVar16[iVar22].m_backend.prec_elem = iVar18;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  iVar12 = (this->m_col).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar12) {
    lVar13 = (long)(this->m_old_i -
                   (this->m_col).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused);
    lVar14 = lVar13 * 0xe + 0x1a;
    lVar20 = 0xe;
    lVar23 = 0;
    do {
      uVar21 = (((this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->val).m_backend.data._M_elems[lVar20];
      pnVar16 = (s->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar14 + -4) =
           *(undefined8 *)(pnVar16[(int)uVar21].m_backend.data._M_elems + 8);
      uVar5 = *(undefined8 *)&pnVar16[(int)uVar21].m_backend.data;
      uVar8 = *(undefined8 *)(pnVar16[(int)uVar21].m_backend.data._M_elems + 2);
      puVar1 = pnVar16[(int)uVar21].m_backend.data._M_elems + 4;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (pnVar16->m_backend).data._M_elems + lVar14 + -8;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar9;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar14 + -0xc;
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar8;
      (pnVar16->m_backend).data._M_elems[lVar14 + -2] = pnVar16[(int)uVar21].m_backend.exp;
      *(bool *)((pnVar16->m_backend).data._M_elems + lVar14 + -1) =
           pnVar16[(int)uVar21].m_backend.neg;
      iVar18 = pnVar16[(int)uVar21].m_backend.prec_elem;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar14;
      puVar1[0] = pnVar16[(int)uVar21].m_backend.fpclass;
      puVar1[1] = iVar18;
      pnVar16 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((pnVar16->m_backend).data._M_elems + lVar14 + -4) =
           *(undefined8 *)(pnVar16[(int)uVar21].m_backend.data._M_elems + 8);
      uVar5 = *(undefined8 *)&pnVar16[(int)uVar21].m_backend.data;
      uVar8 = *(undefined8 *)(pnVar16[(int)uVar21].m_backend.data._M_elems + 2);
      puVar1 = pnVar16[(int)uVar21].m_backend.data._M_elems + 4;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (pnVar16->m_backend).data._M_elems + lVar14 + -8;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar9;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar14 + -0xc;
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar8;
      (pnVar16->m_backend).data._M_elems[lVar14 + -2] = pnVar16[(int)uVar21].m_backend.exp;
      *(bool *)((pnVar16->m_backend).data._M_elems + lVar14 + -1) =
           pnVar16[(int)uVar21].m_backend.neg;
      iVar18 = pnVar16[(int)uVar21].m_backend.prec_elem;
      puVar1 = (pnVar16->m_backend).data._M_elems + lVar14;
      puVar1[0] = pnVar16[(int)uVar21].m_backend.fpclass;
      puVar1[1] = iVar18;
      rStatus->data[lVar13 + lVar23 + 1] = rStatus->data[(int)uVar21];
      lVar23 = lVar23 + 1;
      iVar12 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar20 = lVar20 + 0xf;
      lVar14 = lVar14 + 0xe;
    } while (lVar23 < iVar12);
  }
  local_1e8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  local_1e8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  local_1e8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  local_1e8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006adc40;
  local_1e8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  iVar22 = 2;
  if (0 < iVar12) {
    iVar22 = iVar12;
  }
  local_310 = x;
  local_278 = cStatus;
  local_1f0 = r;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&local_1e8,iVar22);
  local_2c0 = s;
  local_1b0 = y;
  if (this->m_loFree == false) {
    ::soplex::infinity::__tls_init();
    local_308.fpclass = cpp_dec_float_finite;
    local_308.prec_elem = 10;
    local_308.data._M_elems._0_16_ = ZEXT816(0);
    local_308.data._M_elems[4] = 0;
    local_308.data._M_elems[5] = 0;
    local_308.data._M_elems._24_5_ = 0;
    local_308.data._M_elems[7]._1_3_ = 0;
    local_308.data._M_elems._32_5_ = 0;
    local_308.data._M_elems[9]._1_3_ = 0;
    local_308.exp = 0;
    local_308.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_308,
               (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_00601010));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_35c = 0xffffffff;
    }
    else {
      local_2c8 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_35c = 0xffffffff;
      lVar13 = 0;
      local_318 = this;
      do {
        local_2b8.fpclass = cpp_dec_float_finite;
        local_2b8.prec_elem = 10;
        local_2b8.data._M_elems[0] = 0;
        local_2b8.data._M_elems[1] = 0;
        local_2b8.data._M_elems[2] = 0;
        local_2b8.data._M_elems[3] = 0;
        local_2b8.data._M_elems[4] = 0;
        local_2b8.data._M_elems[5] = 0;
        local_2b8.data._M_elems._24_5_ = 0;
        local_2b8.data._M_elems[7]._1_3_ = 0;
        local_2b8.data._M_elems[8] = 0;
        local_2b8.data._M_elems[9] = 0;
        local_2b8.exp = 0;
        local_2b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_2b8,0.0);
        pDVar3 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar26 = &pDVar3[lVar13].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (0 < pDVar3[lVar13].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          lVar14 = 0;
          lVar20 = 0;
          do {
            if (*(int *)((long)(&pSVar26->m_elem->val + 1) + lVar14) != local_318->m_j) {
              pNVar4 = pSVar26->m_elem;
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pNVar4->val).m_backend.data._M_elems + lVar14);
              pcVar24 = &(local_310->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar4->val + 1) + lVar14)].m_backend;
              local_398.fpclass = cpp_dec_float_finite;
              local_398.prec_elem = 10;
              local_398.data._M_elems[0] = 0;
              local_398.data._M_elems[1] = 0;
              local_398.data._M_elems[2] = 0;
              local_398.data._M_elems[3] = 0;
              local_398.data._M_elems[4] = 0;
              local_398.data._M_elems[5] = 0;
              local_398.data._M_elems._24_5_ = 0;
              local_398.data._M_elems[7]._1_3_ = 0;
              local_398.data._M_elems._32_5_ = 0;
              local_398.data._M_elems[9]._1_3_ = 0;
              local_398.exp = 0;
              local_398.neg = false;
              pcVar25 = pcVar15;
              if ((&local_398 != pcVar24) && (pcVar25 = pcVar24, pcVar15 != &local_398)) {
                uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 8);
                local_398.data._M_elems._32_5_ = SUB85(uVar5,0);
                local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_398.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar15->data)._M_elems;
                local_398.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 6);
                local_398.data._M_elems._24_5_ = SUB85(uVar5,0);
                local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_398.exp = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14);
                local_398.neg = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 4);
                local_398._48_8_ =
                     *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_398,pcVar25);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_2b8,&local_398);
            }
            lVar20 = lVar20 + 1;
            lVar14 = lVar14 + 0x3c;
          } while (lVar20 < pDVar3[lVar13].
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused);
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_110,local_2c8,(int)lVar13);
        auVar10 = (undefined1  [16])local_2b8.data._M_elems._0_16_;
        local_398.data._M_elems._32_5_ = local_110.m_backend.data._M_elems._32_5_;
        local_398.data._M_elems[9]._1_3_ = local_110.m_backend.data._M_elems[9]._1_3_;
        local_398.data._M_elems[4] = local_110.m_backend.data._M_elems[4];
        local_398.data._M_elems[5] = local_110.m_backend.data._M_elems[5];
        local_398.data._M_elems._24_5_ = local_110.m_backend.data._M_elems._24_5_;
        local_398.data._M_elems[7]._1_3_ = local_110.m_backend.data._M_elems[7]._1_3_;
        local_398.data._M_elems[0] = local_110.m_backend.data._M_elems[0];
        local_398.data._M_elems[1] = local_110.m_backend.data._M_elems[1];
        uVar5 = local_398.data._M_elems._0_8_;
        local_398.data._M_elems[2] = local_110.m_backend.data._M_elems[2];
        local_398.data._M_elems[3] = local_110.m_backend.data._M_elems[3];
        local_398.exp = local_110.m_backend.exp;
        local_398.neg = local_110.m_backend.neg;
        local_398.fpclass = local_110.m_backend.fpclass;
        local_398.prec_elem = local_110.m_backend.prec_elem;
        if ((local_110.m_backend.neg == true) &&
           (local_398.data._M_elems[0] = local_110.m_backend.data._M_elems[0],
           local_398.data._M_elems[0] != 0 || local_110.m_backend.fpclass != cpp_dec_float_finite))
        {
          local_398.neg = false;
        }
        local_358.data._M_elems[8] = local_2b8.data._M_elems[8];
        local_358.data._M_elems[9] = local_2b8.data._M_elems[9];
        uVar8._5_3_ = local_2b8.data._M_elems[7]._1_3_;
        uVar8._0_5_ = local_2b8.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_2b8.data._M_elems[4];
        local_358.data._M_elems[5] = local_2b8.data._M_elems[5];
        local_358.data._M_elems[6] = local_2b8.data._M_elems[6];
        local_358.data._M_elems[7] = SUB84(uVar8,4);
        local_358.data._M_elems[0] = local_2b8.data._M_elems[0];
        local_358.data._M_elems[1] = local_2b8.data._M_elems[1];
        uVar8 = local_358.data._M_elems._0_8_;
        local_358.data._M_elems[2] = local_2b8.data._M_elems[2];
        local_358.data._M_elems[3] = local_2b8.data._M_elems[3];
        local_358.exp = local_2b8.exp;
        local_358.neg = local_2b8.neg;
        local_358.fpclass = local_2b8.fpclass;
        local_358.prec_elem = local_2b8.prec_elem;
        if ((local_2b8.neg != false) &&
           (local_358.data._M_elems[0] = auVar10._0_4_,
           local_358.data._M_elems[0] != 0 || local_2b8.fpclass != cpp_dec_float_finite)) {
          local_358.neg = (bool)(local_2b8.neg ^ 1);
        }
        local_358.data._M_elems._0_8_ = uVar8;
        local_2b8.data._M_elems._0_16_ = auVar10;
        local_398.data._M_elems._0_8_ = uVar5;
        if (local_2b8.fpclass == cpp_dec_float_NaN ||
            local_110.m_backend.fpclass == cpp_dec_float_NaN) {
          bVar7 = false;
        }
        else {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_398,&local_358);
          bVar7 = 0 < iVar12;
        }
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.data._M_elems._32_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 8);
        local_228.data._M_elems._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
        local_228.data._M_elems._24_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 6);
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.exp = pcVar15->exp;
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.neg = pcVar15->neg;
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.fpclass = pcVar15->fpclass;
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.prec_elem = pcVar15->prec_elem;
        if (local_228.fpclass != cpp_dec_float_NaN) {
          local_398.fpclass = cpp_dec_float_finite;
          local_398.prec_elem = 10;
          local_398.data._M_elems[0] = 0;
          local_398.data._M_elems[1] = 0;
          local_398.data._M_elems[2] = 0;
          local_398.data._M_elems[3] = 0;
          local_398.data._M_elems[4] = 0;
          local_398.data._M_elems[5] = 0;
          local_398.data._M_elems._24_5_ = 0;
          local_398.data._M_elems[7]._1_3_ = 0;
          local_398.data._M_elems._32_5_ = 0;
          local_398.data._M_elems[9]._1_3_ = 0;
          local_398.exp = 0;
          local_398.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_398,1.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_228,&local_398);
          if (iVar12 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,1.0);
          }
        }
        local_270 = lVar13;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_268,local_2c8,(int)lVar13);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems._0_16_ = ZEXT816(0);
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_268,&local_228);
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems._24_5_ = 0;
        local_1a8.data._M_elems[7]._1_3_ = 0;
        local_1a8.data._M_elems._32_5_ = 0;
        local_1a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1a8,&local_2b8,&local_228);
        auVar10 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_358.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
        local_358.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
        local_358.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
        local_358.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_398.data._M_elems[4];
        local_358.data._M_elems[5] = local_398.data._M_elems[5];
        local_358.data._M_elems[0] = local_398.data._M_elems[0];
        local_358.data._M_elems[1] = local_398.data._M_elems[1];
        local_358.data._M_elems[2] = local_398.data._M_elems[2];
        local_358.data._M_elems[3] = local_398.data._M_elems[3];
        local_358.exp = local_398.exp;
        local_358.neg = local_398.neg;
        local_358.fpclass = local_398.fpclass;
        local_358.prec_elem = local_398.prec_elem;
        local_398.data._M_elems._0_16_ = auVar10;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_358,&local_1a8);
        bVar7 = local_358.neg;
        iVar12 = local_358.exp;
        local_168[0] = local_358.data._M_elems[0];
        local_168[1] = local_358.data._M_elems[1];
        auStack_160[0] = local_358.data._M_elems[2];
        auStack_160[1] = local_358.data._M_elems[3];
        local_158[0] = local_358.data._M_elems[4];
        local_158[1] = local_358.data._M_elems[5];
        auStack_150[0] = local_358.data._M_elems[6];
        auStack_150[1] = local_358.data._M_elems[7];
        local_148[0] = local_358.data._M_elems[8];
        local_148[1] = local_358.data._M_elems[9];
        local_1c8 = local_358.fpclass;
        iStack_1c4 = local_358.prec_elem;
        uStack_1c0 = 0;
        (*(local_318->super_PostStep)._vptr_PostStep[7])(&local_a0);
        lVar13 = local_270;
        local_398.data._M_elems._32_5_ = SUB85(local_148._0_8_,0);
        local_398.data._M_elems[9]._1_3_ = SUB83(local_148._0_8_,5);
        local_398.data._M_elems[4] = local_158[0];
        local_398.data._M_elems[5] = local_158[1];
        local_398.data._M_elems._24_5_ = auStack_150._0_5_;
        local_398.data._M_elems[7]._1_3_ = auStack_150[1]._1_3_;
        local_398.data._M_elems[2] = auStack_160[0];
        local_398.data._M_elems[3] = auStack_160[1];
        local_398.data._M_elems[0] = local_168[0];
        local_398.data._M_elems[1] = local_168[1];
        auVar10 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_398.exp = iVar12;
        local_398.neg = bVar7;
        fVar11 = local_1c8;
        local_398.fpclass = local_1c8;
        local_398.prec_elem = iStack_1c4;
        if ((bVar7 != false) &&
           (local_398.data._M_elems[0] = local_168[0],
           local_398.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite)) {
          local_398.neg = (bool)(bVar7 ^ 1);
        }
        s = local_2c0;
        local_398.data._M_elems._0_16_ = auVar10;
        if (((fVar11 != cpp_dec_float_NaN) && (local_a0.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_398,&local_a0), s = local_2c0, iVar12 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_358,0.0);
        }
        local_268.data._M_elems[8] = local_358.data._M_elems[8];
        local_268.data._M_elems[9] = local_358.data._M_elems[9];
        local_268.data._M_elems[4] = local_358.data._M_elems[4];
        local_268.data._M_elems[5] = local_358.data._M_elems[5];
        local_268.data._M_elems[6] = local_358.data._M_elems[6];
        local_268.data._M_elems[7] = local_358.data._M_elems[7];
        local_268.data._M_elems[0] = local_358.data._M_elems[0];
        local_268.data._M_elems[1] = local_358.data._M_elems[1];
        local_268.data._M_elems[2] = local_358.data._M_elems[2];
        local_268.data._M_elems[3] = local_358.data._M_elems[3];
        local_268.exp = local_358.exp;
        local_268.neg = local_358.neg;
        local_268.fpclass = local_358.fpclass;
        local_268.prec_elem = local_358.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_268,&local_228);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1a8,pSVar26,local_318->m_j);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems[0] = 0;
        local_398.data._M_elems[1] = 0;
        local_398.data._M_elems[2] = 0;
        local_398.data._M_elems[3] = 0;
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_268,&local_1a8);
        uVar21 = (uint)lVar13;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_1e8,uVar21,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_2b8);
        this = local_318;
        if (((local_398.fpclass != cpp_dec_float_NaN) && (local_308.fpclass != cpp_dec_float_NaN))
           && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_398,&local_308), 0 < iVar12)) {
          local_308.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
          local_308.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
          local_308.data._M_elems[4] = local_398.data._M_elems[4];
          local_308.data._M_elems[5] = local_398.data._M_elems[5];
          local_308.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
          local_308.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
          local_308.data._M_elems[0] = local_398.data._M_elems[0];
          local_308.data._M_elems[1] = local_398.data._M_elems[1];
          local_308.data._M_elems[2] = local_398.data._M_elems[2];
          local_308.data._M_elems[3] = local_398.data._M_elems[3];
          local_308.exp = local_398.exp;
          local_308.neg = local_398.neg;
          local_308.fpclass = local_398.fpclass;
          local_308.prec_elem = local_398.prec_elem;
          local_35c = uVar21;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if (((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_308.fpclass != cpp_dec_float_NaN)) {
      this_00 = &this->m_bnd;
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&this_00->m_backend,&local_308);
      if (0 < iVar12) goto LAB_00307845;
    }
  }
  else {
    ::soplex::infinity::__tls_init();
    local_308.fpclass = cpp_dec_float_finite;
    local_308.prec_elem = 10;
    local_308.data._M_elems._0_16_ = ZEXT816(0);
    local_308.data._M_elems[4] = 0;
    local_308.data._M_elems[5] = 0;
    local_308.data._M_elems._24_5_ = 0;
    local_308.data._M_elems[7]._1_3_ = 0;
    local_308.data._M_elems._32_5_ = 0;
    local_308.data._M_elems[9]._1_3_ = 0;
    local_308.exp = 0;
    local_308.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_308,*(double *)(in_FS_OFFSET + -8));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_35c = 0xffffffff;
    }
    else {
      local_2c8 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_35c = 0xffffffff;
      lVar13 = 0;
      local_318 = this;
      do {
        local_2b8.fpclass = cpp_dec_float_finite;
        local_2b8.prec_elem = 10;
        local_2b8.data._M_elems[0] = 0;
        local_2b8.data._M_elems[1] = 0;
        local_2b8.data._M_elems[2] = 0;
        local_2b8.data._M_elems[3] = 0;
        local_2b8.data._M_elems[4] = 0;
        local_2b8.data._M_elems[5] = 0;
        local_2b8.data._M_elems._24_5_ = 0;
        local_2b8.data._M_elems[7]._1_3_ = 0;
        local_2b8.data._M_elems[8] = 0;
        local_2b8.data._M_elems[9] = 0;
        local_2b8.exp = 0;
        local_2b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_2b8,0.0);
        pDVar3 = (local_318->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar26 = &pDVar3[lVar13].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (0 < pDVar3[lVar13].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          lVar14 = 0;
          lVar20 = 0;
          do {
            if (*(int *)((long)(&pSVar26->m_elem->val + 1) + lVar14) != local_318->m_j) {
              pNVar4 = pSVar26->m_elem;
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pNVar4->val).m_backend.data._M_elems + lVar14);
              pcVar24 = &(local_310->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar4->val + 1) + lVar14)].m_backend;
              local_398.fpclass = cpp_dec_float_finite;
              local_398.prec_elem = 10;
              local_398.data._M_elems[0] = 0;
              local_398.data._M_elems[1] = 0;
              local_398.data._M_elems[2] = 0;
              local_398.data._M_elems[3] = 0;
              local_398.data._M_elems[4] = 0;
              local_398.data._M_elems[5] = 0;
              local_398.data._M_elems._24_5_ = 0;
              local_398.data._M_elems[7]._1_3_ = 0;
              local_398.data._M_elems._32_5_ = 0;
              local_398.data._M_elems[9]._1_3_ = 0;
              local_398.exp = 0;
              local_398.neg = false;
              pcVar25 = pcVar15;
              if ((&local_398 != pcVar24) && (pcVar25 = pcVar24, pcVar15 != &local_398)) {
                uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 8);
                local_398.data._M_elems._32_5_ = SUB85(uVar5,0);
                local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_398.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar15->data)._M_elems;
                local_398.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 6);
                local_398.data._M_elems._24_5_ = SUB85(uVar5,0);
                local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_398.exp = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14);
                local_398.neg = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 4);
                local_398._48_8_ =
                     *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 8);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_398,pcVar25);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_2b8,&local_398);
            }
            lVar20 = lVar20 + 1;
            lVar14 = lVar14 + 0x3c;
          } while (lVar20 < pDVar3[lVar13].
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused);
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_d8,local_2c8,(int)lVar13);
        auVar10 = (undefined1  [16])local_2b8.data._M_elems._0_16_;
        local_398.data._M_elems._32_5_ = local_d8.m_backend.data._M_elems._32_5_;
        local_398.data._M_elems[9]._1_3_ = local_d8.m_backend.data._M_elems[9]._1_3_;
        local_398.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
        local_398.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
        local_398.data._M_elems._24_5_ = local_d8.m_backend.data._M_elems._24_5_;
        local_398.data._M_elems[7]._1_3_ = local_d8.m_backend.data._M_elems[7]._1_3_;
        local_398.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
        local_398.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
        uVar5 = local_398.data._M_elems._0_8_;
        local_398.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
        local_398.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
        local_398.exp = local_d8.m_backend.exp;
        local_398.neg = local_d8.m_backend.neg;
        local_398.fpclass = local_d8.m_backend.fpclass;
        local_398.prec_elem = local_d8.m_backend.prec_elem;
        if ((local_d8.m_backend.neg == true) &&
           (local_398.data._M_elems[0] = local_d8.m_backend.data._M_elems[0],
           local_398.data._M_elems[0] != 0 || local_d8.m_backend.fpclass != cpp_dec_float_finite)) {
          local_398.neg = false;
        }
        local_358.data._M_elems[8] = local_2b8.data._M_elems[8];
        local_358.data._M_elems[9] = local_2b8.data._M_elems[9];
        uVar9._5_3_ = local_2b8.data._M_elems[7]._1_3_;
        uVar9._0_5_ = local_2b8.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_2b8.data._M_elems[4];
        local_358.data._M_elems[5] = local_2b8.data._M_elems[5];
        local_358.data._M_elems[6] = local_2b8.data._M_elems[6];
        local_358.data._M_elems[7] = SUB84(uVar9,4);
        local_358.data._M_elems[0] = local_2b8.data._M_elems[0];
        local_358.data._M_elems[1] = local_2b8.data._M_elems[1];
        uVar8 = local_358.data._M_elems._0_8_;
        local_358.data._M_elems[2] = local_2b8.data._M_elems[2];
        local_358.data._M_elems[3] = local_2b8.data._M_elems[3];
        local_358.exp = local_2b8.exp;
        local_358.neg = local_2b8.neg;
        local_358.fpclass = local_2b8.fpclass;
        local_358.prec_elem = local_2b8.prec_elem;
        if ((local_2b8.neg != false) &&
           (local_358.data._M_elems[0] = auVar10._0_4_,
           local_358.data._M_elems[0] != 0 || local_2b8.fpclass != cpp_dec_float_finite)) {
          local_358.neg = (bool)(local_2b8.neg ^ 1);
        }
        local_358.data._M_elems._0_8_ = uVar8;
        local_2b8.data._M_elems._0_16_ = auVar10;
        local_398.data._M_elems._0_8_ = uVar5;
        if (local_2b8.fpclass == cpp_dec_float_NaN ||
            local_d8.m_backend.fpclass == cpp_dec_float_NaN) {
          bVar7 = false;
        }
        else {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_398,&local_358);
          bVar7 = 0 < iVar12;
        }
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.data._M_elems._32_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 8);
        local_228.data._M_elems._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
        local_228.data._M_elems._24_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 6);
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.exp = pcVar15->exp;
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.neg = pcVar15->neg;
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.fpclass = pcVar15->fpclass;
        pcVar15 = &local_358;
        if (bVar7) {
          pcVar15 = &local_398;
        }
        local_228.prec_elem = pcVar15->prec_elem;
        if (local_228.fpclass != cpp_dec_float_NaN) {
          local_398.fpclass = cpp_dec_float_finite;
          local_398.prec_elem = 10;
          local_398.data._M_elems[0] = 0;
          local_398.data._M_elems[1] = 0;
          local_398.data._M_elems[2] = 0;
          local_398.data._M_elems[3] = 0;
          local_398.data._M_elems[4] = 0;
          local_398.data._M_elems[5] = 0;
          local_398.data._M_elems._24_5_ = 0;
          local_398.data._M_elems[7]._1_3_ = 0;
          local_398.data._M_elems._32_5_ = 0;
          local_398.data._M_elems[9]._1_3_ = 0;
          local_398.exp = 0;
          local_398.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_398,1.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_228,&local_398);
          if (iVar12 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,1.0);
          }
        }
        local_270 = lVar13;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_268,local_2c8,(int)lVar13);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems._0_16_ = ZEXT816(0);
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_268,&local_228);
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems._24_5_ = 0;
        local_1a8.data._M_elems[7]._1_3_ = 0;
        local_1a8.data._M_elems._32_5_ = 0;
        local_1a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1a8,&local_2b8,&local_228);
        auVar10 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_358.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
        local_358.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
        local_358.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
        local_358.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
        local_358.data._M_elems[4] = local_398.data._M_elems[4];
        local_358.data._M_elems[5] = local_398.data._M_elems[5];
        local_358.data._M_elems[0] = local_398.data._M_elems[0];
        local_358.data._M_elems[1] = local_398.data._M_elems[1];
        local_358.data._M_elems[2] = local_398.data._M_elems[2];
        local_358.data._M_elems[3] = local_398.data._M_elems[3];
        local_358.exp = local_398.exp;
        local_358.neg = local_398.neg;
        local_358.fpclass = local_398.fpclass;
        local_358.prec_elem = local_398.prec_elem;
        local_398.data._M_elems._0_16_ = auVar10;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_358,&local_1a8);
        bVar7 = local_358.neg;
        iVar12 = local_358.exp;
        local_138[0] = local_358.data._M_elems[0];
        local_138[1] = local_358.data._M_elems[1];
        auStack_130[0] = local_358.data._M_elems[2];
        auStack_130[1] = local_358.data._M_elems[3];
        local_128[0] = local_358.data._M_elems[4];
        local_128[1] = local_358.data._M_elems[5];
        auStack_120[0] = local_358.data._M_elems[6];
        auStack_120[1] = local_358.data._M_elems[7];
        local_118[0] = local_358.data._M_elems[8];
        local_118[1] = local_358.data._M_elems[9];
        local_1c8 = local_358.fpclass;
        iStack_1c4 = local_358.prec_elem;
        uStack_1c0 = 0;
        (*(local_318->super_PostStep)._vptr_PostStep[7])(&local_68);
        lVar13 = local_270;
        local_398.data._M_elems._32_5_ = local_118._0_5_;
        local_398.data._M_elems[9]._1_3_ = local_118[1]._1_3_;
        local_398.data._M_elems[4] = local_128[0];
        local_398.data._M_elems[5] = local_128[1];
        local_398.data._M_elems._24_5_ = auStack_120._0_5_;
        local_398.data._M_elems[7]._1_3_ = auStack_120[1]._1_3_;
        local_398.data._M_elems[2] = auStack_130[0];
        local_398.data._M_elems[3] = auStack_130[1];
        local_398.data._M_elems[0] = local_138[0];
        local_398.data._M_elems[1] = local_138[1];
        auVar10 = (undefined1  [16])local_398.data._M_elems._0_16_;
        local_398.exp = iVar12;
        local_398.neg = bVar7;
        fVar11 = local_1c8;
        local_398.fpclass = local_1c8;
        local_398.prec_elem = iStack_1c4;
        if ((bVar7 != false) &&
           (local_398.data._M_elems[0] = local_138[0],
           local_398.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite)) {
          local_398.neg = (bool)(bVar7 ^ 1);
        }
        s = local_2c0;
        local_398.data._M_elems._0_16_ = auVar10;
        if (((fVar11 != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_398,&local_68), s = local_2c0, iVar12 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_358,0.0);
        }
        local_268.data._M_elems[8] = local_358.data._M_elems[8];
        local_268.data._M_elems[9] = local_358.data._M_elems[9];
        local_268.data._M_elems[4] = local_358.data._M_elems[4];
        local_268.data._M_elems[5] = local_358.data._M_elems[5];
        local_268.data._M_elems[6] = local_358.data._M_elems[6];
        local_268.data._M_elems[7] = local_358.data._M_elems[7];
        local_268.data._M_elems[0] = local_358.data._M_elems[0];
        local_268.data._M_elems[1] = local_358.data._M_elems[1];
        local_268.data._M_elems[2] = local_358.data._M_elems[2];
        local_268.data._M_elems[3] = local_358.data._M_elems[3];
        local_268.exp = local_358.exp;
        local_268.neg = local_358.neg;
        local_268.fpclass = local_358.fpclass;
        local_268.prec_elem = local_358.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_268,&local_228);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1a8,pSVar26,local_318->m_j);
        local_398.fpclass = cpp_dec_float_finite;
        local_398.prec_elem = 10;
        local_398.data._M_elems[0] = 0;
        local_398.data._M_elems[1] = 0;
        local_398.data._M_elems[2] = 0;
        local_398.data._M_elems[3] = 0;
        local_398.data._M_elems[4] = 0;
        local_398.data._M_elems[5] = 0;
        local_398.data._M_elems._24_5_ = 0;
        local_398.data._M_elems[7]._1_3_ = 0;
        local_398.data._M_elems._32_5_ = 0;
        local_398.data._M_elems[9]._1_3_ = 0;
        local_398.exp = 0;
        local_398.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_398,&local_268,&local_1a8);
        uVar21 = (uint)lVar13;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_1e8,uVar21,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_2b8);
        this = local_318;
        if (((local_398.fpclass != cpp_dec_float_NaN) && (local_308.fpclass != cpp_dec_float_NaN))
           && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_398,&local_308), iVar12 < 0)) {
          local_308.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
          local_308.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
          local_308.data._M_elems[4] = local_398.data._M_elems[4];
          local_308.data._M_elems[5] = local_398.data._M_elems[5];
          local_308.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
          local_308.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
          local_308.data._M_elems[0] = local_398.data._M_elems[0];
          local_308.data._M_elems[1] = local_398.data._M_elems[1];
          local_308.data._M_elems[2] = local_398.data._M_elems[2];
          local_308.data._M_elems[3] = local_398.data._M_elems[3];
          local_308.exp = local_398.exp;
          local_308.neg = local_398.neg;
          local_308.fpclass = local_398.fpclass;
          local_308.prec_elem = local_398.prec_elem;
          local_35c = uVar21;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if (((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_308.fpclass != cpp_dec_float_NaN)) {
      this_00 = &this->m_bnd;
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&this_00->m_backend,&local_308);
      if (iVar12 < 0) {
LAB_00307845:
        iVar12 = this->m_j;
        pnVar6 = (local_310->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = pnVar6 + iVar12;
        *(undefined8 *)(pnVar6[iVar12].m_backend.data._M_elems + 8) =
             *(undefined8 *)((this_00->m_backend).data._M_elems + 8);
        uVar5 = *(undefined8 *)(this_00->m_backend).data._M_elems;
        uVar8 = *(undefined8 *)((this_00->m_backend).data._M_elems + 2);
        uVar9 = *(undefined8 *)((this_00->m_backend).data._M_elems + 6);
        puVar1 = pnVar6[iVar12].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = *(undefined8 *)((this_00->m_backend).data._M_elems + 4);
        *(undefined8 *)(puVar1 + 2) = uVar9;
        *(undefined8 *)&pnVar6[iVar12].m_backend.data = uVar5;
        *(undefined8 *)(pnVar6[iVar12].m_backend.data._M_elems + 2) = uVar8;
        pnVar6[iVar12].m_backend.exp = (this->m_bnd).m_backend.exp;
        pnVar6[iVar12].m_backend.neg = (this->m_bnd).m_backend.neg;
        pnVar6[iVar12].m_backend.fpclass = (this->m_bnd).m_backend.fpclass;
        local_35c = 0xffffffff;
        iVar18 = (this->m_bnd).m_backend.prec_elem;
        goto LAB_0030790d;
      }
    }
  }
  iVar12 = this->m_j;
  pnVar6 = (local_310->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar16 = pnVar6 + iVar12;
  *(ulong *)(pnVar6[iVar12].m_backend.data._M_elems + 8) =
       CONCAT35(local_308.data._M_elems[9]._1_3_,local_308.data._M_elems._32_5_);
  puVar1 = pnVar6[iVar12].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_308.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_308.data._M_elems[7]._1_3_,local_308.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar6[iVar12].m_backend.data = local_308.data._M_elems._0_8_;
  *(undefined8 *)(pnVar6[iVar12].m_backend.data._M_elems + 2) = local_308.data._M_elems._8_8_;
  pnVar6[iVar12].m_backend.exp = local_308.exp;
  pnVar6[iVar12].m_backend.neg = local_308.neg;
  pnVar6[iVar12].m_backend.fpclass = local_308.fpclass;
  iVar18 = local_308.prec_elem;
LAB_0030790d:
  (pnVar16->m_backend).prec_elem = iVar18;
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_358,
                   &local_1e8.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(int)lVar13);
      pNVar4 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                ((long)(pNVar4->val).m_backend.data._M_elems + lVar14);
      pcVar24 = &(local_310->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems._24_5_ = 0;
      local_308.data._M_elems[7]._1_3_ = 0;
      local_308.data._M_elems._32_5_ = 0;
      local_308.data._M_elems[9]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      pcVar25 = pcVar15;
      if ((&local_308 != pcVar24) && (pcVar25 = pcVar24, pcVar15 != &local_308)) {
        uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 8);
        local_308.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_308.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_308.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar15->data)._M_elems;
        local_308.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
        uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 6);
        local_308.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_308.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_308.exp = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14);
        local_308.neg = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 4);
        local_308._48_8_ = *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_308,pcVar25)
      ;
      local_398.data._M_elems._32_5_ = local_358.data._M_elems._32_5_;
      local_398.data._M_elems[9]._1_3_ = local_358.data._M_elems[9]._1_3_;
      local_398.data._M_elems[4] = local_358.data._M_elems[4];
      local_398.data._M_elems[5] = local_358.data._M_elems[5];
      local_398.data._M_elems._24_5_ = local_358.data._M_elems._24_5_;
      local_398.data._M_elems[7]._1_3_ = local_358.data._M_elems[7]._1_3_;
      local_398.data._M_elems[2] = local_358.data._M_elems[2];
      local_398.data._M_elems[3] = local_358.data._M_elems[3];
      local_398.data._M_elems[0] = local_358.data._M_elems[0];
      local_398.data._M_elems[1] = local_358.data._M_elems[1];
      local_398.exp = local_358.exp;
      local_398.neg = local_358.neg;
      local_398.fpclass = local_358.fpclass;
      local_398.prec_elem = local_358.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_398,&local_308);
      iVar12 = *(int *)((long)(&((this->m_col).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val + 1) + lVar14);
      pnVar16 = (s->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar16[iVar12].m_backend.data._M_elems + 8) =
           CONCAT35(local_398.data._M_elems[9]._1_3_,local_398.data._M_elems._32_5_);
      puVar1 = pnVar16[iVar12].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_398.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_398.data._M_elems[7]._1_3_,local_398.data._M_elems._24_5_);
      *(undefined8 *)&pnVar16[iVar12].m_backend.data = local_398.data._M_elems._0_8_;
      *(undefined8 *)(pnVar16[iVar12].m_backend.data._M_elems + 2) = local_398.data._M_elems._8_8_;
      pnVar16[iVar12].m_backend.exp = local_398.exp;
      pnVar16[iVar12].m_backend.neg = local_398.neg;
      pnVar16[iVar12].m_backend.fpclass = local_398.fpclass;
      pnVar16[iVar12].m_backend.prec_elem = local_398.prec_elem;
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x3c;
    } while (lVar13 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_1f0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar13 = 0x38;
    lVar14 = 0;
    do {
      iVar12 = *(int *)((long)(((this->m_col).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data._M_elems + lVar13);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_398,
                   &(this->m_rowObj).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,iVar12);
      pnVar16 = (local_1b0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar16[iVar12].m_backend.data._M_elems + 8) =
           CONCAT35(local_398.data._M_elems[9]._1_3_,local_398.data._M_elems._32_5_);
      puVar1 = pnVar16[iVar12].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_398.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_398.data._M_elems[7]._1_3_,local_398.data._M_elems._24_5_);
      *(undefined8 *)&pnVar16[iVar12].m_backend.data = local_398.data._M_elems._0_8_;
      *(undefined8 *)(pnVar16[iVar12].m_backend.data._M_elems + 2) = local_398.data._M_elems._8_8_;
      pnVar16[iVar12].m_backend.exp = local_398.exp;
      pnVar16[iVar12].m_backend.neg = local_398.neg;
      pnVar16[iVar12].m_backend.fpclass = local_398.fpclass;
      pnVar16[iVar12].m_backend.prec_elem = local_398.prec_elem;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x3c;
    } while (lVar14 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    uVar17 = (ulong)local_35c;
    lVar14 = 0;
    lVar13 = 0;
    do {
      VVar19 = BASIC;
      if (uVar17 * 0x3c - lVar14 == 0) {
        local_278->data[this->m_j] = BASIC;
        pNVar4 = (this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        iVar12 = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar14 + 8);
        pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar4->val).m_backend.data._M_elems + lVar14);
        if (this->m_loFree == true) {
          VVar19 = ON_LOWER;
          if (iVar12 != 2) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_398,0,(type *)0x0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_398);
            VVar19 = (VarStatus)(iVar12 < 1);
          }
        }
        else {
          VVar19 = ON_UPPER;
          if (iVar12 != 2) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_398,0,(type *)0x0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_398);
            VVar19 = (VarStatus)(0 < iVar12);
          }
        }
      }
      rStatus->data
      [*(int *)((long)(&((this->m_col).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem)->val + 1) + lVar14)] = VVar19;
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x3c;
    } while (lVar13 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (local_35c == 0xffffffff) {
    local_278->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  local_1e8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006adc40;
  if (local_1e8.theelem !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_1e8.theelem);
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}